

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap.h
# Opt level: O1

char * f2cstrv2(char *fstr,char *cstr,int felem_len,int celem_len,int nelem)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (0 < nelem) {
    iVar3 = 0;
    do {
      iVar4 = felem_len;
      if (0 < felem_len) {
        do {
          cVar2 = *fstr;
          fstr = fstr + 1;
          *cstr = cVar2;
          cstr = cstr + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      *cstr = '\0';
      pcVar6 = cstr;
      if (felem_len == 0) {
LAB_00165340:
        *pcVar6 = '\0';
      }
      else {
        pcVar5 = cstr;
        if (0 < felem_len) {
          do {
            pcVar6 = pcVar5;
            if (pcVar5 <= cstr + -(long)felem_len) break;
            pcVar6 = pcVar5 + -1;
            pcVar1 = pcVar5 + -1;
            pcVar5 = pcVar6;
          } while (*pcVar1 == ' ');
          pcVar6 = pcVar6 + (*pcVar6 != ' ');
          goto LAB_00165340;
        }
      }
      iVar3 = iVar3 + 1;
      cstr = cstr + (celem_len - felem_len);
    } while (iVar3 != nelem);
  }
  return cstr + -(long)(nelem * celem_len);
}

Assistant:

static char *f2cstrv2(char *fstr, char* cstr, int felem_len, int celem_len,
               int nelem)
{
   int i,j;

   if( nelem )
      for (i=0; i<nelem; i++, cstr+=(celem_len-felem_len)) {
	 for (j=0; j<felem_len; j++) *cstr++ = *fstr++;
	 *cstr='\0';
	 kill_trailingn( cstr-felem_len, ' ', cstr );
      }
   return( cstr-celem_len*nelem );
}